

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_0::ReferenceRenderer::render
          (ReferenceRenderer *this,Surface *target,Frame *frame)

{
  ushort uVar1;
  int x;
  int y;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  void *pvVar5;
  UVec4 local_90;
  TextureFormat local_80 [5];
  PixelBufferAccess local_58;
  
  pvVar5 = (target->m_pixels).m_ptr;
  pvVar2 = (void *)(target->m_pixels).m_cap;
  if (pvVar2 != pvVar5) {
    lVar3 = 0x16;
    uVar4 = 0;
    do {
      if (*(uint *)((long)pvVar5 + lVar3 + -0x16) < 2) {
        uVar1 = *(ushort *)((long)pvVar5 + lVar3 + -2);
        local_90.m_data._0_8_ = ZEXT58(CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff)));
        local_90.m_data[2] = (uint)*(byte *)((long)pvVar5 + lVar3);
        local_90.m_data[3] = 0xff;
        local_80[0].order = RGBA;
        local_80[0].type = UNORM_INT8;
        pvVar2 = *(void **)(this + 0x10);
        if (pvVar2 != (void *)0x0) {
          pvVar2 = *(void **)(this + 8);
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_58,local_80,*(int *)this,*(int *)(this + 4),1,pvVar2);
        x = *(int *)((long)pvVar5 + lVar3 + -0x12);
        y = *(int *)((long)pvVar5 + lVar3 + -0xe);
        tcu::getSubregion((PixelBufferAccess *)local_80,&local_58,x,y,
                          *(int *)((long)pvVar5 + lVar3 + -10) - x,
                          *(int *)((long)pvVar5 + lVar3 + -6) - y);
        tcu::clear((PixelBufferAccess *)local_80,&local_90);
        pvVar5 = (target->m_pixels).m_ptr;
        pvVar2 = (void *)(target->m_pixels).m_cap;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < (ulong)(((long)pvVar2 - (long)pvVar5 >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

void ReferenceRenderer::render (tcu::Surface* target, const Frame& frame) const
{
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& coloredRect = frame.draws[drawNdx].rect;
		if (frame.draws[drawNdx].drawType == BufferAgeTest::DRAWTYPE_GLES2_RENDER || frame.draws[drawNdx].drawType == BufferAgeTest::DRAWTYPE_GLES2_CLEAR)
		{
			const tcu::UVec4 color(coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255);
			tcu::clear(tcu::getSubregion(target->getAccess(), coloredRect.bottomLeft.x(), coloredRect.bottomLeft.y(),
										 coloredRect.topRight.x()-coloredRect.bottomLeft.x(), coloredRect.topRight.y()-coloredRect.bottomLeft.y()), color);
		}
		else
			DE_ASSERT(false);
	}
}